

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

size_t benchmark::RunSpecifiedBenchmarks
                 (BenchmarkReporter *console_reporter,BenchmarkReporter *file_reporter)

{
  __pthread_internal_list *p_Var1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  mutex_type *pmVar6;
  pointer ptVar7;
  undefined1 uVar8;
  char *pcVar9;
  BenchmarkReporter *pBVar10;
  BenchmarkReporter *pBVar11;
  bool bVar12;
  char cVar13;
  int iVar14;
  int iVar15;
  ostream *poVar16;
  __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
  *this;
  Instance *benchmark_1;
  pointer pIVar17;
  ulong uVar18;
  Instance *pIVar19;
  size_t sVar20;
  pointer iters;
  pointer __p;
  BenchmarkReporter *pBVar21;
  thread *thread;
  pointer ptVar22;
  ulong uVar23;
  char *__s;
  Instance *benchmark;
  bool bVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [16];
  __pthread_internal_list *p_Var28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar34 [16];
  double dVar36;
  undefined1 auVar37 [16];
  string label;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  stat_reports;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  complexity_reports;
  string spec;
  ThreadStats total;
  string mem;
  Notification done;
  Context context;
  ofstream output_file;
  int local_4c4;
  BenchmarkReporter *local_4c0;
  double local_4a8;
  thread local_498;
  undefined8 local_490;
  undefined1 local_488 [16];
  vector<std::thread,_std::allocator<std::thread>_> local_478;
  __pthread_internal_list *local_460;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  local_458;
  undefined1 local_440 [16];
  undefined1 local_430 [24];
  size_type local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  bool local_400;
  _Alloc_hider local_3f8;
  char *local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  int64_t local_3d8;
  TimeUnit local_3d0;
  __pthread_internal_list *local_3c8;
  __pthread_internal_list *p_Stack_3c0;
  double dStack_3b8;
  undefined4 uStack_3b0;
  undefined4 local_3ac;
  int iStack_3a8;
  undefined8 uStack_3a4;
  BigOFunc *local_398;
  int local_390;
  undefined2 local_38c;
  BenchmarkReporter *local_388;
  BenchmarkReporter *local_380;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  local_378;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  local_358;
  string local_338;
  ThreadStats local_318;
  BenchmarkReporter *local_2f8;
  Instance *local_2f0;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8 [16];
  __pthread_internal_list *local_2c8;
  undefined8 uStack_2c0;
  __native_type local_2b8;
  condition_variable local_290 [48];
  undefined1 local_260;
  int local_250 [2];
  double local_248;
  undefined1 local_240;
  ulong local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,FLAGS_benchmark_filter_abi_cxx11_._M_dataplus._M_p,
             FLAGS_benchmark_filter_abi_cxx11_._M_dataplus._M_p +
             FLAGS_benchmark_filter_abi_cxx11_._M_string_length);
  if ((char *)local_338._M_string_length == (char *)0x0) {
    local_338._M_string_length = 0;
LAB_0011c4a8:
    std::__cxx11::string::_M_replace
              ((ulong)&local_338,0,(char *)local_338._M_string_length,0x1346a8);
  }
  else {
    iVar14 = std::__cxx11::string::compare((char *)&local_338);
    if (iVar14 == 0) goto LAB_0011c4a8;
  }
  local_458.
  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ._M_impl.super__Vector_impl_data._M_start = (Instance *)0x0;
  local_458.
  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Instance *)0x0;
  local_458.
  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  internal::BenchmarkFamilies::GetInstance();
  bVar12 = internal::BenchmarkFamilies::FindBenchmarks
                     (&internal::BenchmarkFamilies::GetInstance::instance,&local_338,&local_458);
  pIVar17 = local_458.
            super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar12) {
    pIVar19 = local_458.
              super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (FLAGS_benchmark_list_tests == true) {
      for (; pIVar19 != pIVar17; pIVar19 = pIVar19 + 1) {
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(pIVar19->name)._M_dataplus._M_p,
                             (pIVar19->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
      }
    }
    else {
      std::ofstream::ofstream(&local_230);
      if (console_reporter == (BenchmarkReporter *)0x0) {
        internal::anon_unknown_7::CreateReporter
                  ((anon_unknown_7 *)local_440,&FLAGS_benchmark_format_abi_cxx11_,
                   (uint)FLAGS_color_print);
        local_4c0 = (BenchmarkReporter *)local_440._0_8_;
        console_reporter = (BenchmarkReporter *)local_440._0_8_;
      }
      else {
        local_4c0 = (BenchmarkReporter *)0x0;
      }
      iVar14 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_out_abi_cxx11_);
      if ((file_reporter != (BenchmarkReporter *)0x0) && (iVar14 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "A custom file reporter was provided but --benchmark_out=<file> was not specified."
                   ,0x51);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0011d5a4:
        exit(1);
      }
      iVar14 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_out_abi_cxx11_);
      pBVar21 = (BenchmarkReporter *)0x0;
      if (iVar14 != 0) {
        std::ofstream::open((string *)&local_230,0x142948);
        cVar13 = std::__basic_file<char>::is_open();
        if (cVar13 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"invalid file name: \'",0x14);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,FLAGS_benchmark_out_abi_cxx11_._M_dataplus._M_p
                               ,FLAGS_benchmark_out_abi_cxx11_._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar16);
          goto LAB_0011d5a4;
        }
        if (file_reporter == (BenchmarkReporter *)0x0) {
          internal::anon_unknown_7::CreateReporter
                    ((anon_unknown_7 *)local_440,&FLAGS_benchmark_out_format_abi_cxx11_,OO_None);
          file_reporter = (BenchmarkReporter *)local_440._0_8_;
          pBVar21 = (BenchmarkReporter *)local_440._0_8_;
        }
        else {
          pBVar21 = (BenchmarkReporter *)0x0;
        }
        file_reporter->output_stream_ = (ostream *)&local_230;
        file_reporter->error_stream_ = (ostream *)&local_230;
      }
      if (console_reporter == (BenchmarkReporter *)0x0) {
        internal::CheckHandler::CheckHandler
                  ((CheckHandler *)local_440,"console_reporter != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                   ,"RunMatchingBenchmarks",0x400);
        internal::CheckHandler::~CheckHandler((CheckHandler *)local_440);
      }
      internal::GetNullLogInstance();
      bVar12 = 1 < FLAGS_benchmark_repetitions;
      if (local_458.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_458.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar23 = 10;
      }
      else {
        pIVar17 = local_458.
                  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = 10;
        do {
          uVar23 = (pIVar17->name)._M_string_length;
          if (uVar23 < uVar18) {
            uVar23 = uVar18;
          }
          bVar12 = (bool)(bVar12 | 1 < pIVar17->repetitions);
          pIVar17 = pIVar17 + 1;
          uVar18 = uVar23;
        } while (pIVar17 !=
                 local_458.
                 super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar18 = uVar23 + 7;
      if (!bVar12) {
        uVar18 = uVar23;
      }
      local_250[0] = NumCPUs();
      local_248 = CyclesPerSecond();
      local_248 = local_248 / 1000000.0;
      local_240 = CpuScalingEnabled();
      local_358.
      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.
      super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_388 = console_reporter;
      local_238 = uVar18;
      iVar14 = (**console_reporter->_vptr_BenchmarkReporter)(console_reporter);
      if (((char)iVar14 != '\0') &&
         (((file_reporter == (BenchmarkReporter *)0x0 ||
           (iVar14 = (**file_reporter->_vptr_BenchmarkReporter)(file_reporter,local_250),
           (char)iVar14 != '\0')) &&
          (local_2f0 = local_458.
                       super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
          pIVar19 = local_458.
                    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                    ._M_impl.super__Vector_impl_data._M_start, pBVar10 = pBVar21,
          pBVar11 = file_reporter,
          local_458.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_458.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish)))) {
        do {
          local_2f8 = pBVar11;
          local_380 = pBVar10;
          local_378.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_378.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_378.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (pIVar19->multithreaded == true) {
            std::vector<std::thread,_std::allocator<std::thread>_>::resize
                      (&local_478,(long)pIVar19->threads);
          }
          iVar14 = pIVar19->repetitions;
          if (pIVar19->repetitions == 0) {
            iVar14 = FLAGS_benchmark_repetitions;
          }
          local_4c4 = 0;
          bVar5 = 0;
          if (iVar14 == 1) {
LAB_0011c7d3:
            iters = (pointer)0x1;
            do {
              local_2e8 = local_2d8;
              local_2e0 = 0;
              local_2d8[0] = 0;
              do {
                iVar15 = internal::GetLogLevel();
                if (iVar15 < 2) {
                  poVar16 = internal::GetNullLogInstance();
                }
                else {
                  poVar16 = internal::GetErrorLogInstance();
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-- LOG(",7);
                poVar16 = (ostream *)std::ostream::operator<<(poVar16,2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"): ",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Running ",8);
                poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar16,(pIVar19->name)._M_dataplus._M_p,
                                     (pIVar19->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16," for ",5);
                poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                __p = (pointer)0x134ed3;
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                if (GetBenchmarkLock()::lock == '\0') {
                  RunSpecifiedBenchmarks();
                }
                local_440._0_8_ = GetBenchmarkLock()::lock;
                local_440._8_8_ = local_440._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_440);
                local_440[8] = 1;
                (anonymous_namespace)::GetReportLabel_abi_cxx11_();
                (anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_.
                _M_string_length = 0;
                *(anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_dataplus.
                 _M_p = '\0';
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_440);
                LOCK();
                (anonymous_namespace)::error_message = (char *)0x0;
                UNLOCK();
                local_2b8.__data.__list.__next = (__pthread_internal_list *)0x0;
                local_2b8._16_8_ = 0;
                local_2b8.__data.__list.__prev = (__pthread_internal_list *)0x0;
                local_2b8.__align = 0;
                local_2b8._8_8_ = 0;
                std::condition_variable::condition_variable(local_290);
                local_260 = 0;
                this = (__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                        *)operator_new(0xa8);
                iVar15 = pIVar19->threads;
                this[2]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[3]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                (this->_M_t).
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[1]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[4]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                std::condition_variable::condition_variable((condition_variable *)(this + 5));
                *(int *)&this[0xb]._M_t.
                         super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         .
                         super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                         ._M_head_impl = iVar15;
                *(int *)((long)&this[0xb]._M_t.
                                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                                .
                                super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                                ._M_head_impl + 4) = iVar15;
                this[0xc]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)&local_2b8;
                *(undefined1 *)
                 &this[0xd]._M_t.
                  super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                  _M_head_impl = 0;
                this[0x10]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[0x11]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[0x12]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[0x13]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                *(undefined4 *)
                 &this[0x14]._M_t.
                  super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                  _M_head_impl = 0;
                std::
                __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                ::reset(this,__p);
                ptVar7 = local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                local_318.complexity_n = 0;
                local_318.bytes_processed = 0;
                local_318.items_processed = 0;
                (anonymous_namespace)::running_benchmark = 1;
                if (pIVar19->multithreaded == true) {
                  ptVar22 = local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  if (local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    do {
                      if ((ptVar22->_M_id)._M_thread != 0) {
                        std::thread::join();
                      }
                      ptVar22 = ptVar22 + 1;
                    } while (ptVar22 != ptVar7);
                    if (local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish !=
                        local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
                      uVar23 = 0;
                      do {
                        local_498._M_id._M_thread = (id)0;
                        local_440._0_8_ = operator_new(0x30);
                        (((mutex_type *)local_440._0_8_)->super___mutex_base)._M_mutex.__align =
                             (long)&PTR___State_00141860;
                        *(ThreadStats **)
                         ((long)&(((mutex_type *)local_440._0_8_)->super___mutex_base)._M_mutex + 8)
                             = &local_318;
                        (((mutex_type *)local_440._0_8_)->super___mutex_base)._M_mutex.__data.__kind
                             = (int)uVar23;
                        (((mutex_type *)local_440._0_8_)->super___mutex_base)._M_mutex.__data.__list
                        .__prev = (__pthread_internal_list *)iters;
                        (((mutex_type *)local_440._0_8_)->super___mutex_base)._M_mutex.__data.__list
                        .__next = (__pthread_internal_list *)pIVar19;
                        (((mutex_type *)(local_440._0_8_ + 0x28))->super___mutex_base)._M_mutex.
                        __align = (long)anon_unknown_1::RunInThread;
                        __p = (pointer)local_440;
                        std::thread::_M_start_thread(&local_498,__p,0);
                        if ((mutex_type *)local_440._0_8_ != (mutex_type *)0x0) {
                          (**(code **)(*(long *)local_440._0_8_ + 8))();
                        }
                        if (local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar23]._M_id._M_thread != 0) {
                          std::terminate();
                        }
                        local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar23]._M_id._M_thread =
                             (native_handle_type)local_498._M_id._M_thread;
                        uVar23 = uVar23 + 1;
                      } while (uVar23 < (ulong)((long)local_478.
                                                                                                            
                                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_478.
                                                                                                            
                                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
                    }
                  }
                }
                else {
                  __p = iters;
                  anon_unknown_1::RunInThread(pIVar19,(size_t)iters,0,&local_318);
                }
                Notification::WaitForNotification((Notification *)&local_2b8.__data);
                pmVar6 = (anonymous_namespace)::timer_manager;
                (anonymous_namespace)::running_benchmark = 0;
                local_440._0_8_ = (anonymous_namespace)::timer_manager;
                local_440._8_8_ = local_440._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_440);
                local_440[8] = true;
                if (pmVar6[2].super___mutex_base._M_mutex.__size[0x18] != '\0') {
                  internal::CheckHandler::CheckHandler
                            ((CheckHandler *)&local_498,"!running_",
                             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                             ,"cpu_time_used",0xf4);
                  internal::CheckHandler::~CheckHandler((CheckHandler *)&local_498);
                }
                internal::GetNullLogInstance();
                p_Var28 = *(__pthread_internal_list **)
                           ((long)&pmVar6[3].super___mutex_base._M_mutex + 0x10);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_440);
                pmVar6 = (anonymous_namespace)::timer_manager;
                local_440._0_8_ = (anonymous_namespace)::timer_manager;
                local_440[8] = false;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_440);
                local_440[8] = true;
                uVar8 = local_440[8];
                local_440[8] = true;
                if (pmVar6[2].super___mutex_base._M_mutex.__size[0x18] != '\0') {
                  local_440[8] = uVar8;
                  internal::CheckHandler::CheckHandler
                            ((CheckHandler *)&local_498,"!running_",
                             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                             ,"real_time_used",0xed);
                  internal::CheckHandler::~CheckHandler((CheckHandler *)&local_498);
                }
                internal::GetNullLogInstance();
                p_Var1 = *(__pthread_internal_list **)
                          ((long)&pmVar6[3].super___mutex_base._M_mutex + 8);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_440);
                pmVar6 = (anonymous_namespace)::timer_manager;
                local_440._0_8_ = (anonymous_namespace)::timer_manager;
                local_440[8] = false;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_440);
                local_440[8] = 1;
                if (pmVar6[2].super___mutex_base._M_mutex.__size[0x18] != '\0') {
                  internal::CheckHandler::CheckHandler
                            ((CheckHandler *)&local_498,"!running_",
                             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                             ,"manual_time_used",0xfb);
                  internal::CheckHandler::~CheckHandler((CheckHandler *)&local_498);
                }
                internal::GetNullLogInstance();
                local_460 = pmVar6[3].super___mutex_base._M_mutex.__data.__list.__prev;
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_440);
                std::
                __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                ::reset((__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         *)0x0,__p);
                iVar15 = internal::GetLogLevel();
                if (iVar15 < 2) {
                  poVar16 = internal::GetNullLogInstance();
                }
                else {
                  poVar16 = internal::GetErrorLogInstance();
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-- LOG(",7);
                poVar16 = (ostream *)std::ostream::operator<<(poVar16,2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"): ",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Ran in ",7);
                poVar16 = std::ostream::_M_insert<double>((double)p_Var28);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"/",1);
                poVar16 = std::ostream::_M_insert<double>((double)p_Var1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                local_2c8 = local_460;
                if ((pIVar19->use_manual_time == false) &&
                   (local_2c8 = p_Var28, pIVar19->use_real_time == true)) {
                  local_2c8 = p_Var1;
                }
                uStack_2c0 = 0;
                local_498._M_id._M_thread = (id)local_488;
                local_490 = 0;
                local_488[0] = 0;
                if (GetBenchmarkLock()::lock == '\0') {
                  RunSpecifiedBenchmarks();
                }
                local_440._0_8_ = GetBenchmarkLock()::lock;
                local_440._8_8_ = local_440._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_440);
                local_440[8] = 1;
                (anonymous_namespace)::GetReportLabel_abi_cxx11_();
                std::__cxx11::string::_M_assign((string *)&local_498);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_440);
                __s = (anonymous_namespace)::error_message;
                uVar23 = -(ulong)(ABS(pIVar19->min_time) < 2.220446049250313e-16);
                dVar26 = (double)(~uVar23 & (ulong)pIVar19->min_time |
                                 (ulong)FLAGS_benchmark_min_time & uVar23);
                bVar25 = (anonymous_namespace)::error_message == (char *)0x0;
                bVar24 = iters < (pointer)0x3b9aca00;
                bVar12 = (double)local_2c8 < dVar26;
                bVar2 = (double)p_Var1 < dVar26 * 5.0;
                if (bVar2 && (bVar12 && ((bVar24 && local_4c4 == 0) && bVar25))) {
                  p_Var28 = (__pthread_internal_list *)0x3e112e0be826d695;
                  if (1e-09 <= (double)local_2c8) {
                    p_Var28 = local_2c8;
                  }
                  local_4a8 = (dVar26 * 1.4) / (double)p_Var28;
                  if ((double)local_2c8 / dVar26 <= 0.1 && 10.0 <= local_4a8) {
                    local_4a8 = 10.0;
                  }
                  iVar15 = internal::GetLogLevel();
                  if (iVar15 < 3) {
                    poVar16 = internal::GetNullLogInstance();
                  }
                  else {
                    poVar16 = internal::GetErrorLogInstance();
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-- LOG(",7);
                  poVar16 = (ostream *)std::ostream::operator<<(poVar16,3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"): ",3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"Next iters: ",0xc);
                  dVar36 = (double)(~-(ulong)(1.0 < local_4a8) & 0x4000000000000000 |
                                   (ulong)local_4a8 & -(ulong)(1.0 < local_4a8));
                  dVar29 = dVar36 * (double)(long)iters;
                  dVar26 = (double)(long)iters + 1.0;
                  if (dVar26 <= dVar29) {
                    dVar26 = dVar29;
                  }
                  dVar29 = 1000000000.0;
                  if (dVar26 <= 1000000000.0) {
                    dVar29 = dVar26;
                  }
                  poVar16 = std::ostream::_M_insert<double>(dVar29);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
                  poVar16 = std::ostream::_M_insert<double>(dVar36);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                  iters = (pointer)(long)(int)(dVar29 + 0.5);
                }
                else {
                  local_440._0_8_ = local_430;
                  local_440._8_8_ = 0;
                  local_430[0] = '\0';
                  local_430._16_8_ = &local_410;
                  local_418 = 0;
                  local_410._M_local_buf[0] = '\0';
                  local_400 = false;
                  local_3f8._M_p = (pointer)&local_3e8;
                  local_3f0 = (char *)0x0;
                  local_3e8._M_local_buf[0] = '\0';
                  local_3d8 = 1;
                  local_3d0 = kNanosecond;
                  local_390 = 0;
                  local_38c._0_1_ = false;
                  local_38c._1_1_ = false;
                  iStack_3a8 = 0;
                  uStack_3a4 = 0;
                  dStack_3b8 = 0.0;
                  uStack_3b0 = 0;
                  local_3ac = 0;
                  local_3c8 = (__pthread_internal_list *)0x0;
                  p_Stack_3c0 = (__pthread_internal_list *)0x0;
                  std::__cxx11::string::_M_assign((string *)local_440);
                  pcVar9 = local_3f0;
                  local_400 = __s != (char *)0x0;
                  if (!local_400) {
                    __s = "";
                  }
                  strlen(__s);
                  pBVar21 = local_380;
                  std::__cxx11::string::_M_replace((ulong)&local_3f8,0,pcVar9,(ulong)__s);
                  std::__cxx11::string::_M_assign((string *)(local_430 + 0x10));
                  local_3d8 = (long)pIVar19->threads * (long)iters;
                  local_3d0 = pIVar19->time_unit;
                  if (local_400 == false) {
                    bVar3 = 0.0 < (double)local_2c8;
                    if (pIVar19->use_manual_time == false) {
                      local_460 = p_Var1;
                    }
                    local_3c8 = local_460;
                    auVar4._8_8_ = local_318.items_processed;
                    auVar4._0_8_ = local_318.bytes_processed;
                    auVar30 = auVar4 ^ _DAT_00134170;
                    auVar34._0_4_ = -(uint)((int)DAT_00134170 < auVar30._0_4_);
                    iVar15 = -(uint)(DAT_00134170._4_4_ < auVar30._4_4_);
                    auVar34._8_4_ = -(uint)(DAT_00134170._8_4_ < auVar30._8_4_);
                    iVar35 = -(uint)(DAT_00134170._12_4_ < auVar30._12_4_);
                    auVar37._4_4_ = iVar15;
                    auVar37._0_4_ = iVar15;
                    auVar37._8_4_ = iVar35;
                    auVar37._12_4_ = iVar35;
                    auVar31._4_4_ = -(uint)(auVar30._4_4_ == DAT_00134170._4_4_);
                    auVar31._12_4_ = -(uint)(auVar30._12_4_ == DAT_00134170._12_4_);
                    auVar31._0_4_ = auVar31._4_4_;
                    auVar31._8_4_ = auVar31._12_4_;
                    auVar32._1_3_ = 0;
                    auVar32[0] = bVar3;
                    auVar34._4_4_ = auVar34._0_4_;
                    auVar34._12_4_ = auVar34._8_4_;
                    auVar32[4] = bVar3;
                    auVar32._5_3_ = 0;
                    auVar32[8] = bVar3;
                    auVar32._9_3_ = 0;
                    auVar32[0xc] = bVar3;
                    auVar32._13_3_ = 0;
                    auVar32 = auVar32 & (auVar34 & auVar31 | auVar37);
                    auVar33._0_8_ =
                         CONCAT44((auVar32._4_4_ << 0x1f) >> 0x1f,(auVar32._0_4_ << 0x1f) >> 0x1f);
                    auVar33._8_4_ = (auVar32._8_4_ << 0x1f) >> 0x1f;
                    auVar33._12_4_ = (auVar32._12_4_ << 0x1f) >> 0x1f;
                    auVar30 = auVar4 & _DAT_00134180 | _DAT_00134190;
                    auVar27._0_8_ =
                         ((double)((ulong)local_318.bytes_processed >> 0x20 | 0x4530000000000000) -
                         1.9342813118337666e+25) + auVar30._0_8_;
                    auVar27._8_8_ =
                         ((double)((ulong)local_318.items_processed >> 0x20 | 0x4530000000000000) -
                         1.9342813118337666e+25) + auVar30._8_8_;
                    auVar30._8_8_ = local_2c8;
                    auVar30._0_8_ = local_2c8;
                    auVar30 = divpd(auVar27,auVar30);
                    dStack_3b8 = (double)(auVar30._0_8_ & auVar33._0_8_);
                    uVar23 = auVar30._8_8_ & auVar33._8_8_;
                    uStack_3b0 = (undefined4)uVar23;
                    local_3ac = (undefined4)(uVar23 >> 0x20);
                    local_390 = local_318.complexity_n;
                    uStack_3a4._4_4_ = pIVar19->complexity;
                    local_398 = pIVar19->complexity_lambda;
                    p_Stack_3c0 = p_Var28;
                    if (pIVar19->complexity != oNone) {
                      std::
                      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                      ::push_back(&local_358,(value_type *)local_440);
                    }
                  }
                  std::
                  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  ::push_back(&local_378,(value_type *)local_440);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3f8._M_p != &local_3e8) {
                    operator_delete(local_3f8._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_430._16_8_ != &local_410) {
                    operator_delete((void *)local_430._16_8_);
                  }
                  if ((BenchmarkReporter *)local_440._0_8_ != (BenchmarkReporter *)local_430) {
                    operator_delete((void *)local_440._0_8_);
                  }
                }
                if (local_498._M_id._M_thread != (id)local_488) {
                  operator_delete((void *)local_498._M_id._M_thread);
                }
                std::condition_variable::~condition_variable(local_290);
              } while (bVar2 && (bVar12 && ((bVar24 && local_4c4 == 0) && bVar25)));
              if (local_2e8 != local_2d8) {
                operator_delete(local_2e8);
              }
              local_4c4 = local_4c4 + 1;
              file_reporter = local_2f8;
            } while (local_4c4 != iVar14);
          }
          else {
            bVar5 = FLAGS_benchmark_report_aggregates_only;
            if (pIVar19->report_mode != RM_Unspecified) {
              bVar5 = pIVar19->report_mode == RM_ReportAggregatesOnly;
            }
            if (0 < iVar14) goto LAB_0011c7d3;
          }
          ptVar7 = local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          ptVar22 = local_478.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pIVar19->multithreaded != false) {
            for (; ptVar22 != ptVar7; ptVar22 = ptVar22 + 1) {
              std::thread::join();
            }
          }
          ComputeStats((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                        *)local_440,&local_378);
          if ((pIVar19->complexity != oNone) && (pIVar19->last_benchmark_instance == true)) {
            ComputeBigO((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                         *)&local_2b8.__data,&local_358);
            std::
            vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<benchmark::BenchmarkReporter::Run*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>>
                      ((vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                        *)local_440,local_440._8_8_,local_2b8.__align,local_2b8._8_8_);
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::_M_erase_at_end(&local_358,
                              local_358.
                              super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                       *)&local_2b8.__data);
          }
          if ((bVar5 & 1) != 0) {
            std::
            vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
            ::_M_erase_at_end(&local_378,
                              local_378.
                              super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<benchmark::BenchmarkReporter::Run*,std::vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>>>
                    ((vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                      *)&local_378,
                     local_378.
                     super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_440._0_8_,local_440._8_8_);
          std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::~vector((vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                     *)local_440);
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_478);
          (*local_388->_vptr_BenchmarkReporter[1])
                    (local_388,
                     (vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                      *)&local_378);
          if (file_reporter != (BenchmarkReporter *)0x0) {
            (*file_reporter->_vptr_BenchmarkReporter[1])
                      (file_reporter,
                       (vector<benchmark::BenchmarkReporter::Run,std::allocator<benchmark::BenchmarkReporter::Run>>
                        *)&local_378);
          }
          std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::~vector(&local_378);
          pIVar19 = pIVar19 + 1;
          pBVar10 = local_380;
          pBVar11 = local_2f8;
        } while (pIVar19 != local_2f0);
      }
      (*local_388->_vptr_BenchmarkReporter[2])();
      if (file_reporter != (BenchmarkReporter *)0x0) {
        (*file_reporter->_vptr_BenchmarkReporter[2])(file_reporter);
      }
      std::
      vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
      ::~vector(&local_358);
      if (pBVar21 != (BenchmarkReporter *)0x0) {
        (*pBVar21->_vptr_BenchmarkReporter[4])(pBVar21);
      }
      if (local_4c0 != (BenchmarkReporter *)0x0) {
        (*local_4c0->_vptr_BenchmarkReporter[4])();
      }
      local_230 = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
    }
    sVar20 = ((long)local_458.
                    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_458.
                    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
  }
  else {
    sVar20 = 0;
  }
  std::
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  ::~vector(&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  return sVar20;
}

Assistant:

size_t RunSpecifiedBenchmarks(BenchmarkReporter* console_reporter,
                              BenchmarkReporter* file_reporter) {
  std::string spec = FLAGS_benchmark_filter;
  if (spec.empty() || spec == "all")
    spec = ".";  // Regexp that matches all benchmarks

  std::vector<internal::Benchmark::Instance> benchmarks;
  auto families = internal::BenchmarkFamilies::GetInstance();
  if (!families->FindBenchmarks(spec, &benchmarks)) return 0;

  if (FLAGS_benchmark_list_tests) {
    for (auto const& benchmark : benchmarks)
      std::cout <<  benchmark.name << "\n";
  } else {
    // Setup the reporters
    std::ofstream output_file;
    std::unique_ptr<BenchmarkReporter> default_console_reporter;
    std::unique_ptr<BenchmarkReporter> default_file_reporter;
    if (!console_reporter) {
      auto output_opts = FLAGS_color_print ? ConsoleReporter::OO_Color
                                           : ConsoleReporter::OO_None;
      default_console_reporter = internal::CreateReporter(
          FLAGS_benchmark_format, output_opts);
      console_reporter = default_console_reporter.get();
    }
    std::string const& fname = FLAGS_benchmark_out;
    if (fname == "" && file_reporter) {
      std::cerr << "A custom file reporter was provided but "
                   "--benchmark_out=<file> was not specified." << std::endl;
      std::exit(1);
    }
    if (fname != "") {
      output_file.open(fname);
      if (!output_file.is_open()) {
        std::cerr << "invalid file name: '" << fname << std::endl;
        std::exit(1);
      }
      if (!file_reporter) {
        default_file_reporter = internal::CreateReporter(
            FLAGS_benchmark_out_format, ConsoleReporter::OO_None);
        file_reporter = default_file_reporter.get();
      }
      file_reporter->SetOutputStream(&output_file);
      file_reporter->SetErrorStream(&output_file);
    }
    internal::RunMatchingBenchmarks(benchmarks, console_reporter, file_reporter);
  }
  return benchmarks.size();
}